

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
::rehash(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
         *this,size_t n)

{
  long lVar1;
  size_t sVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  size_t n_00;
  float fVar6;
  
  fVar6 = ceilf((float)(this->size_ctrl).size / 0.875);
  uVar5 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  if (uVar5 <= n) {
    uVar5 = n;
  }
  if (uVar5 == 0) {
    n_00 = 0;
  }
  else {
    uVar4 = uVar5 / 0xf;
    if (uVar4 == 0) {
      bVar3 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar3 = (byte)lVar1 ^ 0x3f;
    }
    n_00 = 0x1d;
    if (0x1d < uVar5) {
      n_00 = (0xfL << (-bVar3 & 0x3f)) - 1;
    }
  }
  sVar2 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    sVar2 = 0;
  }
  if (n_00 == sVar2) {
    return;
  }
  unchecked_rehash(this,n_00);
  return;
}

Assistant:

void rehash(std::size_t n) {
        auto m = size_t(std::ceil(float(size()) / mlf));
        if (m > n)
            n = m;
        if (n)
            n = capacity_for(n);

        if (n != capacity())
            unchecked_rehash(n);
    }